

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grammar.hpp
# Opt level: O2

void jsonip::grammar::double_::
     process_match<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::Reader>,std::pair<char_const*,long>>
               (ReaderState<jsonip::semantic_state,_jsonip::parser::Reader> *state,
               pair<const_char_*,_long> *mp)

{
  double d;
  size_type *local_38;
  string s;
  
  local_38 = &s._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_38,mp->first,mp->first + mp->second);
  d = parser::parse_double((char *)local_38,(int)s._M_dataplus._M_p);
  semantic_state::new_double(state->ss_,d);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

static inline void process_match (S& state, match_pair const& mp)
        {
            const std::string s = state.to_string(mp.first, mp.second);
            const double d = parse_double (s.data(), s.size());
            state.semantic_state().new_double(d);
        }